

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O1

size_t aeshash256_avx256<(ZeroExtension)0>(uchar *p,size_t len,size_t seed,size_t seed2)

{
  sbyte sVar1;
  uint uVar2;
  __m256i *srcend;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  size_t sVar6;
  undefined1 auVar7 [16];
  
  auVar3 = vpbroadcastq_avx512vl();
  auVar5._8_8_ = 0;
  auVar5._0_8_ = seed;
  auVar5 = vpinsrw_avx(auVar5,(int)seed,4);
  auVar5 = vpshufhw_avx(auVar5,0);
  auVar7 = aesenc(auVar3 ^ auVar5,auVar3 ^ auVar5);
  sVar6 = auVar7._0_8_;
  auVar5 = aesenc(auVar7,auVar3);
  if (0x20 < len) {
    vpbroadcastq_avx512vl();
    halt_baddata();
  }
  if (len != 0) {
    sVar1 = ((byte)len < 0x21) * (' ' - (byte)len);
    uVar2 = (uint)(-1 << sVar1) >> sVar1;
    auVar4 = vmovdqu8_avx512vl(*(undefined1 (*) [32])p);
    auVar3[1] = ((byte)(uVar2 >> 1) & 1) * auVar4[1];
    auVar3[0] = ((byte)uVar2 & 1) * auVar4[0];
    auVar3[2] = ((byte)(uVar2 >> 2) & 1) * auVar4[2];
    auVar3[3] = ((byte)(uVar2 >> 3) & 1) * auVar4[3];
    auVar3[4] = ((byte)(uVar2 >> 4) & 1) * auVar4[4];
    auVar3[5] = ((byte)(uVar2 >> 5) & 1) * auVar4[5];
    auVar3[6] = ((byte)(uVar2 >> 6) & 1) * auVar4[6];
    auVar3[7] = ((byte)(uVar2 >> 7) & 1) * auVar4[7];
    auVar3[8] = ((byte)(uVar2 >> 8) & 1) * auVar4[8];
    auVar3[9] = ((byte)(uVar2 >> 9) & 1) * auVar4[9];
    auVar3[10] = ((byte)(uVar2 >> 10) & 1) * auVar4[10];
    auVar3[0xb] = ((byte)(uVar2 >> 0xb) & 1) * auVar4[0xb];
    auVar3[0xc] = ((byte)(uVar2 >> 0xc) & 1) * auVar4[0xc];
    auVar3[0xd] = ((byte)(uVar2 >> 0xd) & 1) * auVar4[0xd];
    auVar3[0xe] = ((byte)(uVar2 >> 0xe) & 1) * auVar4[0xe];
    auVar3[0xf] = ((byte)(uVar2 >> 0xf) & 1) * auVar4[0xf];
    auVar3 = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar7 ^ auVar3;
    if (0xf < len) {
      halt_baddata();
    }
    auVar5 = aesenc(auVar3,auVar3);
    auVar5 = aesenc(auVar5,auVar5);
    auVar5 = aesenc(auVar5,auVar5);
    sVar6 = auVar5._0_8_;
  }
  return sVar6;
}

Assistant:

Q_ALWAYS_INLINE AESHashSeed::AESHashSeed(size_t seed, size_t seed2)
{
    __m128i mseed = mm_cvtsz_si128(seed);
    mseed2 = mm_set1_epz(seed2);

    // mseed (epi16) = [ seed, seed >> 16, seed >> 32, seed >> 48, len, 0, 0, 0 ]
    mseed = _mm_insert_epi16(mseed, short(seed), 4);
    // mseed (epi16) = [ seed, seed >> 16, seed >> 32, seed >> 48, len, len, len, len ]
    mseed = _mm_shufflehi_epi16(mseed, 0);

    // merge with the process-global seed
    __m128i key = _mm_xor_si128(mseed, mseed2);

    // scramble the key
    __m128i state0 = _mm_aesenc_si128(key, key);
    this->state0 = state0;
}